

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.hh
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
yy::operator<<(basic_ostream<char,_std::char_traits<char>_> *ostr,location *loc)

{
  filename_type *pfVar1;
  filename_type *pfVar2;
  size_t __n;
  int iVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  char *pcVar5;
  int iVar6;
  undefined8 uStack_28;
  
  iVar3 = (loc->end).column;
  iVar6 = 0;
  if (0 < iVar3) {
    iVar6 = iVar3 + -1;
  }
  uStack_28 = in_RAX;
  operator<<(ostr,&loc->begin);
  pfVar1 = (loc->end).filename;
  if ((pfVar1 == (filename_type *)0x0) ||
     (((pfVar2 = (loc->begin).filename, pfVar2 != (filename_type *)0x0 &&
       (__n = pfVar2->_M_string_length, __n == pfVar1->_M_string_length)) &&
      ((__n == 0 ||
       (iVar3 = bcmp((pfVar2->_M_dataplus)._M_p,(pfVar1->_M_dataplus)._M_p,__n), iVar3 == 0)))))) {
    if ((loc->end).line <= (loc->begin).line) {
      if (iVar6 <= (loc->begin).column) {
        return ostr;
      }
      pcVar5 = (char *)((long)&uStack_28 + 2);
      uStack_28._0_3_ = CONCAT12(0x2d,(undefined2)uStack_28);
      poVar4 = ostr;
      goto LAB_00106a64;
    }
    uStack_28._0_5_ = CONCAT14(0x2d,(undefined4)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,(char *)((long)&uStack_28 + 4),1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(loc->end).line);
    pcVar5 = (char *)((long)&uStack_28 + 3);
  }
  else {
    uStack_28 = CONCAT17(0x2d,(undefined7)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,(char *)((long)&uStack_28 + 7),1);
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    uStack_28._0_7_ = CONCAT16(0x3a,(undefined6)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 6),1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(loc->end).line);
    pcVar5 = (char *)((long)&uStack_28 + 5);
  }
  *pcVar5 = '.';
LAB_00106a64:
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,1);
  std::ostream::operator<<(poVar4,iVar6);
  return ostr;
}

Assistant:

std::basic_ostream<YYChar>&
  operator<< (std::basic_ostream<YYChar>& ostr, const location& loc)
  {
    location::counter_type end_col
      = 0 < loc.end.column ? loc.end.column - 1 : 0;
    ostr << loc.begin;
    if (loc.end.filename
        && (!loc.begin.filename
            || *loc.begin.filename != *loc.end.filename))
      ostr << '-' << loc.end.filename << ':' << loc.end.line << '.' << end_col;
    else if (loc.begin.line < loc.end.line)
      ostr << '-' << loc.end.line << '.' << end_col;
    else if (loc.begin.column < end_col)
      ostr << '-' << end_col;
    return ostr;
  }